

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O0

void Abc_ResStartPart2(int nInputs,uint *uParts,int nParts)

{
  int iVar1;
  int local_24;
  int local_20;
  int Count;
  int i;
  int nParts_local;
  uint *uParts_local;
  int nInputs_local;
  
  local_24 = 0;
  for (local_20 = 0; local_20 < nParts; local_20 = local_20 + 1) {
    uParts[local_20] = 0;
  }
  for (local_20 = 0; local_20 < nInputs; local_20 = local_20 + 1) {
    uParts[local_20 % nParts] = 1 << ((byte)local_20 & 0x1f) | uParts[local_20 % nParts];
  }
  for (local_20 = 0; local_20 < nParts; local_20 = local_20 + 1) {
    iVar1 = Extra_WordCountOnes(uParts[local_20]);
    local_24 = iVar1 + local_24;
  }
  if (local_24 == nInputs) {
    return;
  }
  __assert_fail("Count == nInputs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                ,0x9e,"void Abc_ResStartPart2(int, unsigned int *, int)");
}

Assistant:

void Abc_ResStartPart2( int nInputs, unsigned uParts[], int nParts )
{
    int i, Count = 0;
    for ( i = 0; i < nParts; i++ )
        uParts[i] = 0;
    for ( i = 0; i < nInputs; i++ )
        uParts[i % nParts] |= (1 << i);
    for ( i = 0; i < nParts; i++ )
        Count += Extra_WordCountOnes( uParts[i] );
    assert( Count == nInputs );
}